

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fillLimited<kj::FixedArray<char,1ul>>
                 (char *target,char *limit,FixedArray<char,_1UL> *first)

{
  char *pcVar1;
  FixedArray<char,_1UL> *pFVar2;
  long lVar3;
  char *i;
  
  lVar3 = 0;
  while( true ) {
    pcVar1 = target + lVar3;
    if ((lVar3 == 1) || (pcVar1 == limit)) break;
    pFVar2 = first + lVar3;
    lVar3 = lVar3 + 1;
    *pcVar1 = pFVar2->content[0];
  }
  return pcVar1;
}

Assistant:

char* fillLimited(char* __restrict__ target, char* limit, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    if (target == limit) return target;
    *target++ = *i++;
  }
  return fillLimited(target, limit, kj::fwd<Rest>(rest)...);
}